

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

float vkt::SpirVAssembly::anon_unknown_5::constructNormalizedFloat
                (deInt32 exponent,deUint32 significand)

{
  int __exponent;
  float fVar1;
  float fVar2;
  
  fVar2 = 1.0;
  for (__exponent = -1; __exponent != -0x18; __exponent = __exponent + -1) {
    fVar1 = 0.0;
    if ((significand >> 0x17 & 1) != 0) {
      fVar1 = ldexpf(1.0,__exponent);
    }
    fVar2 = fVar2 + fVar1;
    significand = significand * 2;
  }
  fVar2 = ldexpf(fVar2,exponent);
  return fVar2;
}

Assistant:

float constructNormalizedFloat (deInt32 exponent, deUint32 significand)
{
	float f = 1.0f;

	for (deInt32 idx = 0; idx < 23; ++idx)
	{
		f += ((significand & 0x800000) == 0) ? 0.f : std::ldexp(1.0f, -(idx + 1));
		significand <<= 1;
	}

	return std::ldexp(f, exponent);
}